

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMP.cpp
# Opt level: O3

void __thiscall bmp_info_header::load(bmp_info_header *this,DataSource *ds)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->size = (ulong)uVar1;
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->width = (ulong)uVar1;
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->height = (ulong)uVar1;
  iVar2 = (*ds->_vptr_DataSource[5])(ds);
  this->planes = (short)iVar2;
  iVar2 = (*ds->_vptr_DataSource[5])(ds);
  this->bit_count = (short)iVar2;
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->compression = (ulong)uVar1;
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->size_image = (ulong)uVar1;
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->x_pels_per_meter = (ulong)uVar1;
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->y_pels_per_meter = (ulong)uVar1;
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->clr_used = (ulong)uVar1;
  uVar1 = (*ds->_vptr_DataSource[7])(ds);
  this->clr_important = (ulong)uVar1;
  return;
}

Assistant:

void load(DataSource& ds)
    {
        size = ds.read4();
        width = ds.read4();
        height = ds.read4();
        planes = ds.read2();
        bit_count = ds.read2();
        compression = ds.read4();
        size_image = ds.read4();
        x_pels_per_meter = ds.read4();
        y_pels_per_meter = ds.read4();
        clr_used = ds.read4();
        clr_important = ds.read4();
    }